

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O0

void EncUp(AmpIO *bd,uint qlaNum)

{
  uint8_t mask;
  uint8_t dout_mask;
  uint qlaNum_local;
  AmpIO *bd_local;
  
  mask = '\x03';
  if (qlaNum == 2) {
    mask = '0';
  }
  AmpIO::WriteDigitalOutput(bd,mask,'3');
  AmpIO::WriteDigitalOutput(bd,mask,'\"');
  Amp1394_Sleep(1e-05);
  AmpIO::WriteDigitalOutput(bd,mask,'\0');
  Amp1394_Sleep(1e-05);
  AmpIO::WriteDigitalOutput(bd,mask,'\x11');
  Amp1394_Sleep(1e-05);
  AmpIO::WriteDigitalOutput(bd,mask,'3');
  return;
}

Assistant:

void EncUp(AmpIO &bd, unsigned int qlaNum)
{
    uint8_t dout_mask = (qlaNum == 2) ? 0x30 : 0x03;
    bd.WriteDigitalOutput(dout_mask, 0x33);
    bd.WriteDigitalOutput(dout_mask, 0x22);
    Amp1394_Sleep(0.00001);
    bd.WriteDigitalOutput(dout_mask, 0x00);
    Amp1394_Sleep(0.00001);
    bd.WriteDigitalOutput(dout_mask, 0x11);
    Amp1394_Sleep(0.00001);
    bd.WriteDigitalOutput(dout_mask, 0x33);
}